

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939_timedate_srv.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 in_EDI;
  int unaff_retaddr;
  j1939_timedate_srv_priv *in_stack_00000008;
  int ret;
  timespec ts;
  j1939_timedate_srv_priv *priv;
  j1939_timedate_srv_priv *in_stack_ffffffffffffffc8;
  timespec local_28;
  int *local_18;
  undefined4 uVar2;
  
  uVar2 = 0;
  local_18 = (int *)malloc(0x68);
  if (local_18 == (int *)0x0) {
    err(1);
  }
  memset(local_18,0,0x68);
  libj1939_init_sockaddr_can((sockaddr_can *)(local_18 + 2),0xea00);
  iVar1 = j1939_timedate_srv_parse_args
                    (in_stack_00000008,unaff_retaddr,(char **)CONCAT44(uVar2,in_EDI));
  if (iVar1 == 0) {
    clock_gettime(1,&local_28);
    *(__time_t *)(local_18 + 0x12) = local_28.tv_sec;
    *(long *)(local_18 + 0x14) = local_28.tv_nsec;
    iVar1 = j1939_timedate_srv_sock_prepare(in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      do {
        iVar1 = j1939_timedate_srv_process_events_and_tasks(in_stack_ffffffffffffffc8);
      } while (iVar1 == 0);
      close(local_18[0xc]);
      free(*(void **)(local_18 + 0xe));
      close(local_18[1]);
      close(*local_18);
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939_timedate_srv_priv *priv;
	struct timespec ts;
	int ret;

	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	bzero(priv, sizeof(*priv));

	libj1939_init_sockaddr_can(&priv->sockname, J1939_PGN_REQUEST_PGN);

	ret = j1939_timedate_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	ret = j1939_timedate_srv_sock_prepare(priv);
	if (ret)
		return ret;

	while (1) {
		ret = j1939_timedate_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);

	close(priv->sock_main);
	close(priv->sock_nack);

	return ret;
}